

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureUnitTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::MultiTexShader::shadeFragments
          (MultiTexShader *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  uint uVar1;
  int iVar2;
  pointer pMVar3;
  pointer pVVar4;
  pointer pVVar5;
  GenericVec4 *pGVar6;
  int i;
  long lVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  deUint32 *pdVar11;
  long lVar12;
  long lVar13;
  Vec4 *pVVar14;
  int i_2;
  float v;
  float fVar15;
  Vector<float,_4> res_4;
  Vector<float,_4> res_6;
  Vector<float,_4> res_5;
  Vector<float,_4> res;
  Vec3 coords3D [4];
  Vec2 coords2D [4];
  Vector<float,_4> res_1;
  Vec2 texCoords [4];
  Vector<float,_4> res_3;
  Vector<float,_4> res_2;
  Vec4 outColors [4];
  Vec4 texSamples [4];
  float local_254;
  long local_250;
  FragmentShadingContext *local_248;
  FragmentPacket *local_240;
  float local_238 [2];
  float afStack_230 [5];
  int iStack_21c;
  rr *local_218;
  int aiStack_210 [6];
  float *local_1f8;
  int aiStack_1f0 [6];
  float *local_1d8;
  undefined8 uStack_1d0;
  ulong local_1c0;
  Vec3 local_1b8;
  float afStack_1ac [9];
  Vec2 local_188;
  float local_180 [6];
  undefined8 local_168;
  undefined8 uStack_160;
  rr *local_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 local_140;
  rr *local_138;
  undefined1 *local_130;
  float local_128 [8];
  FragmentPacket *local_108;
  ulong local_100;
  ulong local_f8;
  long local_f0;
  undefined8 local_e8;
  undefined1 *local_e0;
  undefined8 local_d8;
  undefined1 *local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  deUint32 local_b8 [16];
  Vec4 local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_108 = packets;
  if (0 < numPackets) {
    local_100 = (ulong)(uint)numPackets;
    local_f8 = 0;
    local_1c0 = 0;
    local_248 = context;
    do {
      local_b8[0] = 0;
      local_b8[1] = 0;
      local_b8[2] = 0;
      local_b8[3] = 0;
      local_b8[4] = 0;
      local_b8[5] = 0;
      local_b8[6] = 0;
      local_b8[7] = 0;
      local_b8[8] = 0;
      local_b8[9] = 0;
      local_b8[10] = 0;
      local_b8[0xb] = 0;
      local_b8[0xc] = 0;
      local_b8[0xd] = 0;
      local_b8[0xe] = 0;
      local_b8[0xf] = 0;
      if (0 < *(int *)&(this->super_ShaderProgram).field_0x154) {
        local_240 = local_108 + local_1c0;
        local_254 = 1.0 / (float)*(int *)&(this->super_ShaderProgram).field_0x154;
        local_f0 = 0;
        lVar12 = 0;
        local_250 = 0;
        do {
          local_48 = 0;
          uStack_40 = 0;
          local_58 = 0;
          uStack_50 = 0;
          local_68 = 0;
          uStack_60 = 0;
          local_78.m_data[0] = 0.0;
          local_78.m_data[1] = 0.0;
          local_78.m_data[2] = 0.0;
          local_78.m_data[3] = 0.0;
          rr::readTriangleVarying<float>((rr *)&local_188,local_240,local_248,0,0);
          local_1b8.m_data._0_8_ = (rr *)&local_188;
          local_1b8.m_data[2] = 0.0;
          afStack_1ac[0] = 1.4013e-45;
          local_158 = (rr *)0x0;
          lVar7 = 0;
          do {
            *(float *)((long)&local_158 + lVar7 * 4) =
                 local_188.m_data[(int)local_1b8.m_data[lVar7 + 2]];
            lVar7 = lVar7 + 1;
          } while (lVar7 == 1);
          rr::readTriangleVarying<float>((rr *)&local_1f8,local_240,local_248,0,1);
          local_218 = (rr *)&local_1f8;
          aiStack_210[0] = 0;
          aiStack_210[1] = 1;
          local_150 = 0;
          lVar7 = 2;
          do {
            *(undefined4 *)((long)&local_158 + lVar7 * 4) =
                 *(undefined4 *)
                  ((long)&local_1f8 + (long)*(int *)((long)&local_218 + lVar7 * 4) * 4);
            lVar7 = lVar7 + 1;
          } while (lVar7 == 3);
          rr::readTriangleVarying<float>((rr *)&local_1d8,local_240,local_248,0,2);
          local_238 = (float  [2])&local_1d8;
          afStack_230[0] = 0.0;
          afStack_230[1] = 1.4013e-45;
          local_148 = 0;
          lVar7 = 2;
          do {
            *(undefined4 *)((long)&local_150 + lVar7 * 4) =
                 *(undefined4 *)((long)&local_1d8 + (long)(int)local_238[lVar7] * 4);
            lVar7 = lVar7 + 1;
          } while (lVar7 == 3);
          rr::readTriangleVarying<float>((rr *)&local_168,local_240,local_248,0,3);
          lVar7 = local_f0;
          local_138 = (rr *)&local_168;
          local_130 = (undefined1 *)0x100000000;
          local_140 = 0;
          lVar8 = 2;
          do {
            *(undefined4 *)((long)&local_148 + lVar8 * 4) =
                 *(undefined4 *)
                  ((long)&local_168 + (long)*(int *)((long)&local_138 + lVar8 * 4) * 4);
            lVar8 = lVar8 + 1;
          } while (lVar8 == 3);
          pMVar3 = (this->m_transformations).
                   super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_138 = local_158;
          local_130 = &DAT_3f8000003f800000;
          local_1d8 = (float *)0x0;
          uStack_1d0 = 0;
          lVar8 = (long)(pMVar3->m_data).m_data[0].m_data + lVar12;
          lVar10 = 0;
          do {
            fVar15 = 0.0;
            lVar13 = 0;
            do {
              fVar15 = fVar15 + *(float *)(lVar8 + lVar13 * 4) *
                                *(float *)((long)&local_138 + lVar13);
              lVar13 = lVar13 + 4;
            } while (lVar13 != 0x10);
            *(float *)((long)&local_1d8 + lVar10 * 4) = fVar15;
            lVar10 = lVar10 + 1;
            lVar8 = lVar8 + 4;
          } while (lVar10 != 4);
          local_188.m_data = (float  [2])&local_1d8;
          local_180[0] = 0.0;
          local_180[1] = 1.4013e-45;
          local_180[2] = 2.8026e-45;
          local_1b8.m_data[0] = 0.0;
          local_1b8.m_data[1] = 0.0;
          local_1b8.m_data[2] = 0.0;
          lVar8 = 2;
          do {
            *(undefined4 *)((long)&local_1c0 + lVar8 * 4) =
                 *(undefined4 *)((long)&local_1d8 + (long)(int)local_188.m_data[lVar8] * 4);
            lVar8 = lVar8 + 1;
          } while (lVar8 != 5);
          local_c8 = local_150;
          local_c0 = &DAT_3f8000003f800000;
          local_168 = 0;
          uStack_160 = 0;
          lVar8 = (long)(pMVar3->m_data).m_data[0].m_data + lVar12;
          lVar10 = 0;
          do {
            fVar15 = 0.0;
            lVar13 = 0;
            do {
              fVar15 = fVar15 + *(float *)(lVar8 + lVar13 * 4) *
                                *(float *)((long)&local_c8 + lVar13);
              lVar13 = lVar13 + 4;
            } while (lVar13 != 0x10);
            *(float *)((long)&local_168 + lVar10 * 4) = fVar15;
            lVar10 = lVar10 + 1;
            lVar8 = lVar8 + 4;
          } while (lVar10 != 4);
          local_218 = (rr *)&local_168;
          aiStack_210[0] = 0;
          aiStack_210[1] = 1;
          aiStack_210[2] = 2;
          afStack_1ac[2] = 0.0;
          afStack_1ac[0] = 0.0;
          afStack_1ac[1] = 0.0;
          lVar8 = 3;
          do {
            local_1b8.m_data[lVar8] = *(float *)((long)&local_168 + (long)(&iStack_21c)[lVar8] * 4);
            lVar8 = lVar8 + 1;
          } while (lVar8 != 6);
          local_d8 = local_148;
          local_d0 = &DAT_3f8000003f800000;
          local_128[4] = 0.0;
          local_128[5] = 0.0;
          local_128[6] = 0.0;
          local_128[7] = 0.0;
          lVar8 = (long)(pMVar3->m_data).m_data[0].m_data + lVar12;
          lVar10 = 0;
          do {
            fVar15 = 0.0;
            lVar13 = 0;
            do {
              fVar15 = fVar15 + *(float *)(lVar8 + lVar13 * 4) *
                                *(float *)((long)&local_d8 + lVar13);
              lVar13 = lVar13 + 4;
            } while (lVar13 != 0x10);
            local_128[lVar10 + 4] = fVar15;
            lVar10 = lVar10 + 1;
            lVar8 = lVar8 + 4;
          } while (lVar10 != 4);
          local_1f8 = local_128 + 4;
          aiStack_1f0[0] = 0;
          aiStack_1f0[1] = 1;
          aiStack_1f0[2] = 2;
          afStack_1ac[5] = 0.0;
          afStack_1ac[3] = 0.0;
          afStack_1ac[4] = 0.0;
          lVar8 = 2;
          do {
            afStack_1ac[lVar8 + 1] = local_128[(long)*(int *)((long)&local_1f8 + lVar8 * 4) + 4];
            lVar8 = lVar8 + 1;
          } while (lVar8 != 5);
          local_e8 = local_140;
          local_e0 = &DAT_3f8000003f800000;
          local_128[0] = 0.0;
          local_128[1] = 0.0;
          local_128[2] = 0.0;
          local_128[3] = 0.0;
          lVar8 = (long)(pMVar3->m_data).m_data[0].m_data + lVar12;
          lVar10 = 0;
          do {
            fVar15 = 0.0;
            lVar13 = 0;
            do {
              fVar15 = fVar15 + *(float *)(lVar8 + lVar13 * 4) *
                                *(float *)((long)&local_e8 + lVar13);
              lVar13 = lVar13 + 4;
            } while (lVar13 != 0x10);
            local_128[lVar10] = fVar15;
            lVar10 = lVar10 + 1;
            lVar8 = lVar8 + 4;
          } while (lVar10 != 4);
          local_238 = (float  [2])local_128;
          afStack_230[0] = 0.0;
          afStack_230[1] = 1.4013e-45;
          afStack_230[2] = 2.8026e-45;
          afStack_1ac[8] = 0.0;
          afStack_1ac[6] = 0.0;
          afStack_1ac[7] = 0.0;
          lVar8 = 9;
          do {
            local_1b8.m_data[lVar8] = local_128[(int)(&local_254)[lVar8]];
            lVar8 = lVar8 + 1;
          } while (lVar8 != 0xc);
          local_218 = (rr *)&local_1b8;
          aiStack_210[0] = 0;
          aiStack_210[1] = 1;
          local_188.m_data[0] = 0.0;
          local_188.m_data[1] = 0.0;
          lVar8 = 0;
          do {
            local_188.m_data[lVar8] = local_1b8.m_data[aiStack_210[lVar8]];
            lVar8 = lVar8 + 1;
          } while (lVar8 == 1);
          local_1f8 = afStack_1ac;
          aiStack_1f0[0] = 0;
          aiStack_1f0[1] = 1;
          local_180[0] = 0.0;
          local_180[1] = 0.0;
          lVar8 = 2;
          do {
            local_188.m_data[lVar8] = afStack_1ac[*(int *)((long)&local_1f8 + lVar8 * 4)];
            lVar8 = lVar8 + 1;
          } while (lVar8 == 3);
          local_238 = (float  [2])(afStack_1ac + 3);
          afStack_230[0] = 0.0;
          afStack_230[1] = 1.4013e-45;
          local_180[2] = 0.0;
          local_180[3] = 0.0;
          lVar8 = 2;
          do {
            local_180[lVar8] = afStack_1ac[(long)(int)local_238[lVar8] + 3];
            lVar8 = lVar8 + 1;
          } while (lVar8 == 3);
          local_1d8 = afStack_1ac + 6;
          uStack_1d0 = 0x100000000;
          local_180[4] = 0.0;
          local_180[5] = 0.0;
          lVar8 = 2;
          do {
            local_180[lVar8 + 2] = afStack_1ac[(long)*(int *)((long)&local_1d8 + lVar8 * 4) + 6];
            lVar8 = lVar8 + 1;
          } while (lVar8 == 3);
          uVar1 = (this->m_unitTypes).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start[local_250];
          iVar2 = (int)local_250;
          if ((int)uVar1 < 0x8513) {
            if (uVar1 == 0xde1) {
              sglr::rc::Texture2D::sample4
                        ((this->super_ShaderProgram).m_uniforms.
                         super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>.
                         _M_impl.super__Vector_impl_data._M_start[iVar2 * 4].sampler.tex2D,&local_78
                         ,&local_188,0.0);
            }
            else if (uVar1 == 0x806f) {
              sglr::rc::Texture3D::sample4
                        ((this->super_ShaderProgram).m_uniforms.
                         super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>.
                         _M_impl.super__Vector_impl_data._M_start[iVar2 * 4].sampler.tex3D,&local_78
                         ,&local_1b8,0.0);
            }
          }
          else if (uVar1 == 0x8513) {
            sglr::rc::TextureCube::sample4
                      ((this->super_ShaderProgram).m_uniforms.
                       super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>.
                       _M_impl.super__Vector_impl_data._M_start[iVar2 * 4].sampler.texCube,&local_78
                       ,&local_1b8,0.0);
          }
          else if (uVar1 == 0x8c1a) {
            sglr::rc::Texture2DArray::sample4
                      ((this->super_ShaderProgram).m_uniforms.
                       super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>.
                       _M_impl.super__Vector_impl_data._M_start[iVar2 * 4].sampler.tex2DArray,
                       &local_78,&local_1b8,0.0);
          }
          pVVar4 = (this->m_texScales).
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pVVar5 = (this->m_texBiases).
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pdVar11 = local_b8;
          lVar8 = 0;
          pVVar14 = &local_78;
          do {
            local_238[0] = 0.0;
            local_238[1] = 0.0;
            afStack_230[0] = 0.0;
            afStack_230[1] = 0.0;
            lVar10 = 0;
            do {
              local_238[lVar10] =
                   pVVar14->m_data[lVar10] * *(float *)((long)pVVar4->m_data + lVar10 * 4 + lVar7);
              lVar10 = lVar10 + 1;
            } while (lVar10 != 4);
            local_1f8 = (float *)0x0;
            aiStack_1f0[0] = 0;
            aiStack_1f0[1] = 0;
            lVar10 = 0;
            do {
              *(float *)((long)&local_1f8 + lVar10 * 4) =
                   local_238[lVar10] + *(float *)((long)pVVar5->m_data + lVar10 * 4 + lVar7);
              lVar10 = lVar10 + 1;
            } while (lVar10 != 4);
            local_218 = (rr *)0x0;
            aiStack_210[0] = 0;
            aiStack_210[1] = 0;
            lVar10 = 0;
            do {
              *(float *)((long)&local_218 + lVar10 * 4) =
                   *(float *)((long)&local_1f8 + lVar10 * 4) * local_254;
              lVar10 = lVar10 + 1;
            } while (lVar10 != 4);
            lVar10 = 0;
            do {
              pdVar11[lVar10] =
                   (deUint32)(*(float *)((long)&local_218 + lVar10 * 4) + (float)pdVar11[lVar10]);
              lVar10 = lVar10 + 1;
            } while (lVar10 != 4);
            lVar8 = lVar8 + 1;
            pVVar14 = pVVar14 + 1;
            pdVar11 = pdVar11 + 4;
          } while (lVar8 != 4);
          local_250 = local_250 + 1;
          lVar12 = lVar12 + 0x40;
          local_f0 = lVar7 + 0x10;
        } while (local_250 < *(int *)&(this->super_ShaderProgram).field_0x154);
      }
      pGVar6 = local_248->outputArray;
      iVar2 = local_248->numFragmentOutputs;
      iVar9 = iVar2 * (int)local_f8;
      lVar12 = 0xc;
      do {
        pGVar6[iVar9].v.uData[0] = *(deUint32 *)((long)&local_c8 + lVar12 + 4);
        pGVar6[iVar9].v.uData[1] = *(deUint32 *)((long)&local_c0 + lVar12);
        pGVar6[iVar9].v.uData[2] = *(deUint32 *)((long)&local_c0 + lVar12 + 4);
        pGVar6[iVar9].v.uData[3] = *(deUint32 *)((long)local_b8 + lVar12);
        lVar12 = lVar12 + 0x10;
        iVar9 = iVar9 + iVar2;
      } while (lVar12 != 0x4c);
      local_1c0 = local_1c0 + 1;
      local_f8 = (ulong)((int)local_f8 + 4);
    } while (local_1c0 != local_100);
  }
  return;
}

Assistant:

void MultiTexShader::shadeFragments	(rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
{
	DE_ASSERT((int)m_unitTypes.size() == m_numUnits);
	DE_ASSERT((int)m_transformations.size() == m_numUnits);
	DE_ASSERT((int)m_lodDerivateParts.size() == m_numUnits);

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	{
		rr::FragmentPacket& packet				= packets[packetNdx];
		const float			colorMultiplier		= 1.0f / (float)m_numUnits;
		Vec4				outColors[4]		= { Vec4(0.0f), Vec4(0.0f), Vec4(0.0f), Vec4(0.0f) };

		for (int unitNdx = 0; unitNdx < m_numUnits; unitNdx++)
		{
			tcu::Vec4 texSamples[4];

			// Read tex coords
			const tcu::Vec2 texCoords[4] =
			{
				rr::readTriangleVarying<float>(packet, context, 0, 0).xy(),
				rr::readTriangleVarying<float>(packet, context, 0, 1).xy(),
				rr::readTriangleVarying<float>(packet, context, 0, 2).xy(),
				rr::readTriangleVarying<float>(packet, context, 0, 3).xy(),
			};

			// Transform
			tcu::Vec3 coords3D[4] =
			{
				(m_transformations[unitNdx] * Vec4(texCoords[0].x(), texCoords[0].y(), 1.0f, 1.0f)).xyz(),
				(m_transformations[unitNdx] * Vec4(texCoords[1].x(), texCoords[1].y(), 1.0f, 1.0f)).xyz(),
				(m_transformations[unitNdx] * Vec4(texCoords[2].x(), texCoords[2].y(), 1.0f, 1.0f)).xyz(),
				(m_transformations[unitNdx] * Vec4(texCoords[3].x(), texCoords[3].y(), 1.0f, 1.0f)).xyz(),
			};

			// To 2D
			const tcu::Vec2 coords2D[4] =
			{
				coords3D[0].xy(),
				coords3D[1].xy(),
				coords3D[2].xy(),
				coords3D[3].xy(),
			};

			// Sample
			switch (m_unitTypes[unitNdx])
			{
				case GL_TEXTURE_2D:			m_uniforms[4*unitNdx].sampler.tex2D->sample4(texSamples, coords2D);			break;
				case GL_TEXTURE_CUBE_MAP:	m_uniforms[4*unitNdx].sampler.texCube->sample4(texSamples, coords3D);		break;
				case GL_TEXTURE_2D_ARRAY:	m_uniforms[4*unitNdx].sampler.tex2DArray->sample4(texSamples, coords3D);	break;
				case GL_TEXTURE_3D:			m_uniforms[4*unitNdx].sampler.tex3D->sample4(texSamples, coords3D);			break;
				default:
					DE_ASSERT(DE_FALSE);
			}

			// Add to sum
			for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
				outColors[fragNdx] += colorMultiplier * (texSamples[fragNdx]*m_texScales[unitNdx] + m_texBiases[unitNdx]);
		}

		// output
		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
			rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, outColors[fragNdx]);
	}
}